

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_vector_dense.cpp
# Opt level: O1

void __thiscall
test_vector_dense_vector_subtraction_Test::TestBody(test_vector_dense_vector_subtraction_Test *this)

{
  DeathTest *pDVar1;
  DeathTest *pDVar2;
  pointer pdVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  StringLike<const_char_*> *regex;
  StringLike<const_char_*> *regex_00;
  StringLike<const_char_*> *regex_01;
  StringLike<const_char_*> *regex_02;
  double *element;
  pointer pdVar7;
  long lVar8;
  char *pcVar9;
  DeathTest *gtest_dt;
  AssertionResult gtest_ar;
  Vector_Dense<double,_0UL> dynamic_vector_2;
  Vector_Dense<double,_2UL> static_vector_2;
  Vector_Dense<double,_0UL> dynamic_vector_0;
  Vector_Dense<double,_0UL> result_0;
  Vector_Dense<double,_0UL> dynamic_vector_1;
  Vector_Dense<double,_3UL> static_vector_0;
  Vector_Dense<double,_3UL> static_vector_1;
  Vector_Dense<double,_3UL> result_3;
  Vector_Dense<double,_3UL> result_2;
  Vector_Dense<double,_3UL> result_1;
  DeathTest *local_1d0;
  undefined1 local_1c8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1c0;
  double local_1b8;
  AssertHelper local_1a0;
  Vector_Dense<double,_0UL> local_198;
  Vector_Dense<double,_2UL> local_178;
  Vector_Dense<double,_0UL> local_168;
  type local_150;
  Vector_Dense<double,_0UL> local_138;
  Vector_Dense<double,_3UL> local_120;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_108;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_f0;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_d8;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_c0;
  Vector_Dense<double,_3UL> local_a8;
  type local_90;
  type local_78;
  type local_60;
  type local_48;
  
  local_1c8 = (undefined1  [8])0xbff0000000000000;
  _Stack_1c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xc000000000000000;
  local_1b8 = -3.0;
  local_138.super_vector<double,_std::allocator<double>_>.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x3;
  local_138.super_vector<double,_std::allocator<double>_>.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)local_1c8;
  Disa::Vector_Dense<double,_0UL>::Vector_Dense(&local_168,(initializer_list<double> *)&local_138);
  local_1c8 = (undefined1  [8])0xbff0000000000000;
  _Stack_1c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xc000000000000000;
  local_1b8 = -3.0;
  local_120.super_array<double,_3UL>._M_elems[1] = 1.48219693752374e-323;
  local_120.super_array<double,_3UL>._M_elems[0] = (double)local_1c8;
  Disa::Vector_Dense<double,_0UL>::Vector_Dense(&local_138,(initializer_list<double> *)&local_120);
  local_1c8 = (undefined1  [8])0xc010000000000000;
  _Stack_1c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xc014000000000000;
  local_1b8 = -6.0;
  local_a8.super_array<double,_3UL>._M_elems[1] = 1.48219693752374e-323;
  local_a8.super_array<double,_3UL>._M_elems[0] = (double)local_1c8;
  Disa::Vector_Dense<double,_3UL>::Vector_Dense(&local_120,(initializer_list<double> *)&local_a8);
  local_1c8 = (undefined1  [8])0xc010000000000000;
  _Stack_1c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xc014000000000000;
  local_1b8 = -6.0;
  local_150.super_vector<double,_std::allocator<double>_>.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (double *)0x3;
  local_150.super_vector<double,_std::allocator<double>_>.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)local_1c8;
  Disa::Vector_Dense<double,_3UL>::Vector_Dense(&local_a8,(initializer_list<double> *)&local_150);
  Disa::operator-(&local_150,&local_168,&local_138);
  Disa::operator-(&local_48,&local_120,&local_138);
  Disa::operator-(&local_60,&local_168,&local_a8);
  Disa::operator-(&local_78,&local_120,&local_a8);
  pdVar3 = local_150.super_vector<double,_std::allocator<double>_>.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  if (local_150.super_vector<double,_std::allocator<double>_>.
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      != local_150.super_vector<double,_std::allocator<double>_>.
         super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_finish) {
    pdVar7 = local_150.super_vector<double,_std::allocator<double>_>.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    do {
      testing::internal::CmpHelperFloatingPointEQ<double>
                ((internal *)local_1c8,"element","0.0",*pdVar7,0.0);
      if (local_1c8[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_198);
        pcVar9 = "";
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1c0._M_pi !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar9 = ((_Alloc_hider *)&(_Stack_1c0._M_pi)->_vptr__Sp_counted_base)->_M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_178,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
                   ,0xd5,pcVar9);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_178,(Message *)&local_198)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_178);
        if (local_198.super_vector<double,_std::allocator<double>_>.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          (**(code **)((long)*local_198.super_vector<double,_std::allocator<double>_>.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start + 8))();
        }
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1c0._M_pi !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&_Stack_1c0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     _Stack_1c0._M_pi);
      }
      pdVar7 = pdVar7 + 1;
    } while (pdVar7 != pdVar3);
  }
  lVar8 = 0;
  do {
    testing::internal::CmpHelperFloatingPointEQ<double>
              ((internal *)local_1c8,"element","-3.0",
               *(double *)((long)local_48.super_array<double,_3UL>._M_elems + lVar8),-3.0);
    if (local_1c8[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_198);
      pcVar9 = "";
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1c0._M_pi !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = ((_Alloc_hider *)&(_Stack_1c0._M_pi)->_vptr__Sp_counted_base)->_M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_178,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
                 ,0xd6,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_178,(Message *)&local_198);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_178);
      if (local_198.super_vector<double,_std::allocator<double>_>.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        (**(code **)((long)*local_198.super_vector<double,_std::allocator<double>_>.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1c0._M_pi !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&_Stack_1c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   _Stack_1c0._M_pi);
    }
    lVar8 = lVar8 + 8;
  } while (lVar8 != 0x18);
  lVar8 = 0;
  do {
    testing::internal::CmpHelperFloatingPointEQ<double>
              ((internal *)local_1c8,"element","3.0",
               *(double *)((long)local_60.super_array<double,_3UL>._M_elems + lVar8),3.0);
    if (local_1c8[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_198);
      pcVar9 = "";
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1c0._M_pi !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = ((_Alloc_hider *)&(_Stack_1c0._M_pi)->_vptr__Sp_counted_base)->_M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_178,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
                 ,0xd7,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_178,(Message *)&local_198);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_178);
      if (local_198.super_vector<double,_std::allocator<double>_>.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        (**(code **)((long)*local_198.super_vector<double,_std::allocator<double>_>.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1c0._M_pi !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&_Stack_1c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   _Stack_1c0._M_pi);
    }
    lVar8 = lVar8 + 8;
  } while (lVar8 != 0x18);
  lVar8 = 0;
  do {
    testing::internal::CmpHelperFloatingPointEQ<double>
              ((internal *)local_1c8,"element","0.0",
               *(double *)((long)local_78.super_array<double,_3UL>._M_elems + lVar8),0.0);
    if (local_1c8[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_198);
      pcVar9 = "";
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1c0._M_pi !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = ((_Alloc_hider *)&(_Stack_1c0._M_pi)->_vptr__Sp_counted_base)->_M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_178,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
                 ,0xd8,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_178,(Message *)&local_198);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_178);
      if (local_198.super_vector<double,_std::allocator<double>_>.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        (**(code **)((long)*local_198.super_vector<double,_std::allocator<double>_>.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1c0._M_pi !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&_Stack_1c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   _Stack_1c0._M_pi);
    }
    lVar8 = lVar8 + 8;
  } while (lVar8 != 0x18);
  local_198.super_vector<double,_std::allocator<double>_>.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_198.super_vector<double,_std::allocator<double>_>.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_198.super_vector<double,_std::allocator<double>_>.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_178.super_array<double,_2UL>._M_elems[0] = 0.0;
  local_178.super_array<double,_2UL>._M_elems[1] = 0.0;
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    local_1a0.data_ = (AssertHelperData *)0x147235;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)local_1c8,
               (testing *)&local_1a0,regex);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_c0,(PolymorphicMatcher *)local_1c8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1c0._M_pi !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1c0._M_pi);
    }
    bVar4 = testing::internal::DeathTest::Create
                      ("dynamic_vector_0 - dynamic_vector_2",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_c0,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
                       ,0xdc,&local_1d0);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_c0);
    pDVar1 = local_1d0;
    iVar6 = 10;
    if (bVar4) {
      if (local_1d0 != (DeathTest *)0x0) {
        iVar6 = (*local_1d0->_vptr_DeathTest[2])(local_1d0);
        pDVar2 = local_1d0;
        if (iVar6 == 0) {
          iVar6 = (*local_1d0->_vptr_DeathTest[3])(local_1d0);
          bVar4 = testing::internal::ExitedUnsuccessfully(iVar6);
          iVar6 = (*pDVar2->_vptr_DeathTest[4])(pDVar2,(ulong)bVar4);
          if ((char)iVar6 != '\0') goto LAB_001111b7;
          iVar6 = 10;
          bVar4 = false;
        }
        else {
          if (iVar6 == 1) {
            bVar4 = testing::internal::AlwaysTrue();
            if (bVar4) {
              Disa::operator-(&local_90,&local_168,&local_198);
              if (local_90.super_vector<double,_std::allocator<double>_>.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_90.super_vector<double,_std::allocator<double>_>.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (long)local_90.super_vector<double,_std::allocator<double>_>.
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data._M_end_of_storage -
                                (long)local_90.super_vector<double,_std::allocator<double>_>.
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data._M_start);
              }
            }
            (*local_1d0->_vptr_DeathTest[5])(local_1d0,2);
            (*pDVar2->_vptr_DeathTest[5])(pDVar2,0);
          }
LAB_001111b7:
          iVar6 = 0;
          bVar4 = true;
        }
        (*pDVar1->_vptr_DeathTest[1])(pDVar1);
        if (!bVar4) goto LAB_001111ca;
      }
      iVar6 = 0;
    }
LAB_001111ca:
    if (iVar6 != 0) goto LAB_001111ce;
  }
  else {
LAB_001111ce:
    testing::Message::Message((Message *)local_1c8);
    pcVar9 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              (&local_1a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
               ,0xdc,pcVar9);
    testing::internal::AssertHelper::operator=(&local_1a0,(Message *)local_1c8);
    testing::internal::AssertHelper::~AssertHelper(&local_1a0);
    if (local_1c8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1c8 + 8))();
    }
  }
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    local_1a0.data_ = (AssertHelperData *)0x147235;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)local_1c8,
               (testing *)&local_1a0,regex_00);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_d8,(PolymorphicMatcher *)local_1c8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1c0._M_pi !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1c0._M_pi);
    }
    bVar4 = testing::internal::DeathTest::Create
                      ("static_vector_0 - dynamic_vector_2",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_d8,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
                       ,0xdd,&local_1d0);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_d8);
    pDVar1 = local_1d0;
    iVar6 = 0xc;
    if (bVar4) {
      if (local_1d0 != (DeathTest *)0x0) {
        iVar6 = (*local_1d0->_vptr_DeathTest[2])(local_1d0);
        pDVar2 = local_1d0;
        if (iVar6 == 0) {
          iVar6 = (*local_1d0->_vptr_DeathTest[3])(local_1d0);
          bVar4 = testing::internal::ExitedUnsuccessfully(iVar6);
          iVar6 = (*pDVar2->_vptr_DeathTest[4])(pDVar2,(ulong)bVar4);
          if ((char)iVar6 != '\0') goto LAB_00111337;
          iVar6 = 0xc;
          bVar4 = false;
        }
        else {
          if (iVar6 == 1) {
            bVar4 = testing::internal::AlwaysTrue();
            if (bVar4) {
              Disa::operator-((type *)local_1c8,&local_120,&local_198);
            }
            (*local_1d0->_vptr_DeathTest[5])(local_1d0,2);
            (*pDVar2->_vptr_DeathTest[5])(pDVar2,0);
          }
LAB_00111337:
          iVar6 = 0;
          bVar4 = true;
        }
        (*pDVar1->_vptr_DeathTest[1])(pDVar1);
        if (!bVar4) goto LAB_0011134a;
      }
      iVar6 = 0;
    }
LAB_0011134a:
    if (iVar6 != 0) goto LAB_0011134e;
  }
  else {
LAB_0011134e:
    testing::Message::Message((Message *)local_1c8);
    pcVar9 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              (&local_1a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
               ,0xdd,pcVar9);
    testing::internal::AssertHelper::operator=(&local_1a0,(Message *)local_1c8);
    testing::internal::AssertHelper::~AssertHelper(&local_1a0);
    if (local_1c8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1c8 + 8))();
    }
  }
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    local_1a0.data_ = (AssertHelperData *)0x147235;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)local_1c8,
               (testing *)&local_1a0,regex_01);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_f0,(PolymorphicMatcher *)local_1c8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1c0._M_pi !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1c0._M_pi);
    }
    bVar4 = testing::internal::DeathTest::Create
                      ("dynamic_vector_0 - static_vector_2",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_f0,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
                       ,0xde,&local_1d0);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_f0);
    pDVar1 = local_1d0;
    iVar6 = 0xe;
    if (bVar4) {
      if (local_1d0 != (DeathTest *)0x0) {
        iVar6 = (*local_1d0->_vptr_DeathTest[2])(local_1d0);
        pDVar2 = local_1d0;
        if (iVar6 == 0) {
          iVar6 = (*local_1d0->_vptr_DeathTest[3])(local_1d0);
          bVar4 = testing::internal::ExitedUnsuccessfully(iVar6);
          iVar6 = (*pDVar2->_vptr_DeathTest[4])(pDVar2,(ulong)bVar4);
          if ((char)iVar6 != '\0') goto LAB_001114af;
          iVar6 = 0xe;
          bVar4 = false;
        }
        else {
          if (iVar6 == 1) {
            bVar4 = testing::internal::AlwaysTrue();
            if (bVar4) {
              Disa::operator-(&local_168,&local_178);
            }
            (*local_1d0->_vptr_DeathTest[5])(local_1d0,2);
            (*pDVar2->_vptr_DeathTest[5])(pDVar2,0);
          }
LAB_001114af:
          iVar6 = 0;
          bVar4 = true;
        }
        (*pDVar1->_vptr_DeathTest[1])(pDVar1);
        if (!bVar4) goto LAB_001114c2;
      }
      iVar6 = 0;
    }
LAB_001114c2:
    if (iVar6 != 0) goto LAB_001114c6;
  }
  else {
LAB_001114c6:
    testing::Message::Message((Message *)local_1c8);
    pcVar9 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              (&local_1a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
               ,0xde,pcVar9);
    testing::internal::AssertHelper::operator=(&local_1a0,(Message *)local_1c8);
    testing::internal::AssertHelper::~AssertHelper(&local_1a0);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_1c8 !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1c8 + 8))();
    }
  }
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    local_1a0.data_ = (AssertHelperData *)0x147235;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)local_1c8,
               (testing *)&local_1a0,regex_02);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_108,(PolymorphicMatcher *)local_1c8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1c0._M_pi !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1c0._M_pi);
    }
    bVar5 = testing::internal::DeathTest::Create
                      ("static_vector_0 - static_vector_2",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_108,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
                       ,0xdf,&local_1d0);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_108);
    pDVar1 = local_1d0;
    bVar4 = true;
    if (bVar5) {
      if (local_1d0 != (DeathTest *)0x0) {
        iVar6 = (*local_1d0->_vptr_DeathTest[2])(local_1d0);
        pDVar2 = local_1d0;
        if (iVar6 == 0) {
          iVar6 = (*local_1d0->_vptr_DeathTest[3])(local_1d0);
          bVar4 = testing::internal::ExitedUnsuccessfully(iVar6);
          iVar6 = (*local_1d0->_vptr_DeathTest[4])(local_1d0,(ulong)bVar4);
          if ((char)iVar6 != '\0') goto LAB_0011162f;
          bVar4 = true;
          bVar5 = false;
        }
        else {
          if (iVar6 == 1) {
            bVar4 = testing::internal::AlwaysTrue();
            if (bVar4) {
              Disa::operator-((type *)local_1c8,&local_120,&local_178);
            }
            (*local_1d0->_vptr_DeathTest[5])(local_1d0,2);
            (*pDVar2->_vptr_DeathTest[5])(pDVar2,0);
          }
LAB_0011162f:
          bVar4 = false;
          bVar5 = true;
        }
        (*pDVar1->_vptr_DeathTest[1])(pDVar1);
        if (!bVar5) goto LAB_00111642;
      }
      bVar4 = false;
    }
LAB_00111642:
    if (!bVar4) goto LAB_0011169c;
  }
  testing::Message::Message((Message *)local_1c8);
  pcVar9 = testing::internal::DeathTest::LastMessage();
  testing::internal::AssertHelper::AssertHelper
            (&local_1a0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
             ,0xdf,pcVar9);
  testing::internal::AssertHelper::operator=(&local_1a0,(Message *)local_1c8);
  testing::internal::AssertHelper::~AssertHelper(&local_1a0);
  if (local_1c8 != (undefined1  [8])0x0) {
    (**(code **)(*(long *)local_1c8 + 8))();
  }
LAB_0011169c:
  if (local_198.super_vector<double,_std::allocator<double>_>.
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      != (pointer)0x0) {
    operator_delete(local_198.super_vector<double,_std::allocator<double>_>.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_198.super_vector<double,_std::allocator<double>_>.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_198.super_vector<double,_std::allocator<double>_>.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_150.super_vector<double,_std::allocator<double>_>.
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      != (double *)0x0) {
    operator_delete(local_150.super_vector<double,_std::allocator<double>_>.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_150.super_vector<double,_std::allocator<double>_>.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_150.super_vector<double,_std::allocator<double>_>.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_138.super_vector<double,_std::allocator<double>_>.
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      != (double *)0x0) {
    operator_delete(local_138.super_vector<double,_std::allocator<double>_>.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_138.super_vector<double,_std::allocator<double>_>.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_138.super_vector<double,_std::allocator<double>_>.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_168.super_vector<double,_std::allocator<double>_>.
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      != (pointer)0x0) {
    operator_delete(local_168.super_vector<double,_std::allocator<double>_>.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_168.super_vector<double,_std::allocator<double>_>.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_168.super_vector<double,_std::allocator<double>_>.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(test_vector_dense, vector_subtraction) {
  Vector_Dense<Scalar, 0> dynamic_vector_0 = {-1.0, -2.0, -3.0};
  Vector_Dense<Scalar, 0> dynamic_vector_1 = {-1.0, -2.0, -3.0};
  Vector_Dense<Scalar, 3> static_vector_0 = {-4.0, -5.0, -6.0};
  Vector_Dense<Scalar, 3> static_vector_1 = {-4.0, -5.0, -6.0};

  Vector_Dense<Scalar, 0> result_0 = dynamic_vector_0 - dynamic_vector_1;
  Vector_Dense<Scalar, 3> result_1 = static_vector_0 - dynamic_vector_1;
  Vector_Dense<Scalar, 3> result_2 = dynamic_vector_0 - static_vector_1;
  Vector_Dense<Scalar, 3> result_3 = static_vector_0 - static_vector_1;
  FOR_EACH(element, result_0) EXPECT_DOUBLE_EQ(element, 0.0);
  FOR_EACH(element, result_1) EXPECT_DOUBLE_EQ(element, -3.0);
  FOR_EACH(element, result_2) EXPECT_DOUBLE_EQ(element, 3.0);
  FOR_EACH(element, result_3) EXPECT_DOUBLE_EQ(element, 0.0);

  Vector_Dense<Scalar, 0> dynamic_vector_2;
  Vector_Dense<Scalar, 2> static_vector_2;
  EXPECT_DEATH(dynamic_vector_0 - dynamic_vector_2, "./*");
  EXPECT_DEATH(static_vector_0 - dynamic_vector_2, "./*");
  EXPECT_DEATH(dynamic_vector_0 - static_vector_2, "./*");
  EXPECT_DEATH(static_vector_0 - static_vector_2, "./*");
}